

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdArgs.cpp
# Opt level: O1

void __thiscall asl::CmdArgs::CmdArgs(CmdArgs *this,String *spec)

{
  int *piVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong in_RCX;
  char *pcVar4;
  int iVar5;
  int iVar6;
  Array<char> all;
  Array<asl::String> a;
  File file;
  char buffer [256];
  Array<char> local_1d0;
  Array<asl::String> *local_1c8;
  String local_1c0;
  Dic<asl::String> *local_1a8;
  Dic<asl::Array<asl::String>_> *local_1a0;
  Array<asl::String> local_198;
  Array<asl::String> *local_190;
  String *local_188;
  File local_180;
  String local_138 [11];
  
  local_188 = spec;
  Array<asl::String>::alloc(&this->_args,0);
  Array<asl::String>::alloc(&this->_rest,0);
  Array<asl::Map<asl::String,_asl::String>::KeyVal>::alloc
            ((Array<asl::Map<asl::String,_asl::String>::KeyVal> *)&this->_opts,0);
  Array<asl::Map<asl::String,_asl::Array<asl::String>_>::KeyVal>::alloc
            ((Array<asl::Map<asl::String,_asl::Array<asl::String>_>::KeyVal> *)&this->_multi,0);
  Array<asl::String>::alloc(&this->_unused,0);
  String::String(local_138,"/proc/self/cmdline");
  File::File(&local_180,local_138,READ);
  if (local_138[0]._size != 0) {
    free((void *)local_138[0].field_2._0_8_);
  }
  if (local_180._file == (FILE *)0x0) goto LAB_0013dbd0;
  local_1c8 = &this->_rest;
  local_1a8 = &this->_opts;
  local_1a0 = &this->_multi;
  local_190 = &this->_unused;
  Array<char>::alloc(&local_1d0,0);
  do {
    uVar3 = File::read(&local_180,(int)local_138,(void *)0x100,in_RCX);
    iVar5 = (int)uVar3;
    if (iVar5 < 1) break;
    Array<char>::alloc((Array<char> *)&local_1c0,iVar5);
    in_RCX = 0;
    do {
      *(char *)(local_1c0._0_8_ + in_RCX) = *(char *)((long)&local_138[0]._size + in_RCX);
      in_RCX = in_RCX + 1;
    } while ((uVar3 & 0xffffffff) != in_RCX);
    Array<char>::append(&local_1d0,(Array<char> *)&local_1c0);
    LOCK();
    uVar2 = local_1c0._0_8_ + 0xffffffffffffffe8 + 0x10;
    *(int *)uVar2 = *(int *)uVar2 + -1;
    UNLOCK();
    if (*(int *)uVar2 == 0) {
      free((anon_union_16_2_78e7fdac_for_String_2 *)(local_1c0._0_8_ + 0xffffffffffffffe8 + 8));
      local_1c0._0_8_ = (String *)0x0;
    }
  } while (0x100 < iVar5);
  if (*(int *)(local_1d0._a + -0x10) != 0) {
    iVar5 = 0;
    Array<asl::String>::alloc(&local_198,0);
    do {
      iVar6 = -1;
      if (iVar5 < *(int *)(local_1d0._a + -0x10)) {
        pcVar4 = local_1d0._a + iVar5;
        iVar6 = iVar5;
        do {
          if (*pcVar4 == '\0') goto LAB_0013db21;
          iVar6 = iVar6 + 1;
          pcVar4 = pcVar4 + 1;
        } while (*(int *)(local_1d0._a + -0x10) != iVar6);
        iVar6 = -1;
      }
LAB_0013db21:
      if (iVar6 == -1) goto LAB_0013db59;
      String::String(&local_1c0,local_1d0._a + iVar5);
      Array<asl::String>::insert(&local_198,-1,&local_1c0);
      if (local_1c0._size != 0) {
        free(local_1c0.field_2._str);
      }
      iVar5 = iVar6 + 1;
    } while( true );
  }
  goto LAB_0013dbae;
LAB_0013db59:
  iVar5 = *(int *)&local_198._a[-1].field_2;
  Array<asl::String>::with<char_const*>((Array<asl::String> *)&local_1c0);
  parse(this,iVar5,(char **)local_1c0._0_8_,local_188);
  LOCK();
  uVar2 = local_1c0._0_8_ + 0xffffffffffffffe8 + 0x10;
  *(int *)uVar2 = *(int *)uVar2 + -1;
  UNLOCK();
  if (*(int *)uVar2 == 0) {
    free((anon_union_16_2_78e7fdac_for_String_2 *)(local_1c0._0_8_ + 0xffffffffffffffe8 + 8));
    local_1c0._0_8_ = (String *)0x0;
  }
  Array<asl::String>::~Array(&local_198);
LAB_0013dbae:
  LOCK();
  piVar1 = (int *)(local_1d0._a + -8);
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  if (*piVar1 == 0) {
    free(local_1d0._a + -0x10);
    local_1d0._a = (char *)0x0;
  }
LAB_0013dbd0:
  File::~File(&local_180);
  return;
}

Assistant:

CmdArgs::CmdArgs(const String& spec)
{
#ifdef _WIN32
	int nArgs = 0;
	LPWSTR* wargs = CommandLineToArgvW(GetCommandLineW(), &nArgs);
	if (wargs == NULL)
		return;
	Array<String> a;
	for (int i = 0; i < nArgs; i++)
		a << wargs[i];

	LocalFree(wargs);
	parse(-nArgs, (char**)(a.with<const char*>()).data(), spec);
#else
	File file("/proc/self/cmdline", File::READ);
	if (!file)
		return;
	char buffer[256];
	Array<char> all;
	int n;
	while ((n = file.read(buffer, sizeof(buffer))) > 0)
	{
		all.append(Array<char>((char*)buffer, n));
		if (n <= (int)sizeof(buffer))
			break;
	}
	if (all.length() == 0)
		return;
	int i = 0, j = 0;
	Array<String> a;
	while ((j = all.indexOf('\0', i)) != -1)
	{
		a << String(&all[i]);
		i = j + 1;
	}

	parse(a.length(), (char**)(a.with<const char*>()).data(), spec);
#endif
}